

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::formatReconstructedExpression(ostream *os,string *lhs,StringRef *op,string *rhs)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if (rhs->_M_string_length + lhs->_M_string_length < 0x28) {
    lVar1 = std::__cxx11::string::find((char)lhs,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)rhs,10);
      if (lVar1 == -1) {
        pcVar4 = " ";
        goto LAB_001194ba;
      }
    }
  }
  pcVar4 = "\n";
LAB_001194ba:
  poVar2 = std::operator<<((ostream *)os,(string *)lhs);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar3 = operator<<((ostream *)poVar2,op);
  poVar2 = std::operator<<((ostream *)poVar3,pcVar4);
  std::operator<<(poVar2,(string *)rhs);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }